

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

RuntimePtr Jinx::CreateRuntime(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  RuntimePtr RVar2;
  shared_ptr<Jinx::Impl::Runtime> runtime;
  undefined1 local_39;
  __shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<Jinx::IRuntime,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Allocator<Jinx::Impl::Runtime>>
            ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (Allocator<Jinx::Impl::Runtime> *)&local_39);
  std::__shared_ptr<Jinx::IRuntime,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Impl::Runtime,void>(local_28,&local_38);
  Impl::RegisterLibCore((RuntimePtr *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  _Var1._M_pi = local_38._M_refcount._M_pi;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_IRuntime = (_func_int **)local_38._M_ptr;
  in_RDI[1]._vptr_IRuntime = (_func_int **)_Var1._M_pi;
  local_38._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  RVar2.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (RuntimePtr)RVar2.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t RuntimePtr CreateRuntime()
	{
		auto runtime = std::allocate_shared<Impl::Runtime>(Allocator<Impl::Runtime>());
		Impl::RegisterLibCore(runtime);
		return runtime;
	}